

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

Xt __thiscall cppforth::Forth::blWordFind(Forth *this,string *wordBuffer)

{
  char cVar1;
  pointer plVar2;
  byte bVar3;
  __type_conflict _Var4;
  int iVar5;
  Cell CVar6;
  Cell CVar7;
  Xt XVar8;
  size_type sVar9;
  char cVar10;
  pointer __lhs;
  long lVar11;
  allocator<char> local_51;
  string localName;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (wordBuffer,0);
  iVar5 = getSourceBufferRemain(this);
  if (0 < iVar5) {
    while( true ) {
      CVar6 = getSourceAddress(this);
      CVar7 = getSourceBufferOffset(this);
      bVar3 = dataSpaceAt(this,CVar6 + CVar7);
      iVar5 = getSourceBufferRemain(this);
      if ((iVar5 < 1) || ((bVar3 != 0x20 && (iVar5 = isspace((uint)bVar3), iVar5 == 0)))) break;
      incSourceBufferOffset(this);
    }
  }
  iVar5 = getSourceBufferRemain(this);
  if (0 < iVar5) {
    while (iVar5 = getSourceBufferRemain(this), 0 < iVar5) {
      CVar6 = getSourceAddress(this);
      CVar7 = getSourceBufferOffset(this);
      bVar3 = dataSpaceAt(this,CVar6 + CVar7);
      if ((bVar3 == 0x20) || (iVar5 = isspace((uint)bVar3), iVar5 != 0)) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (wordBuffer,bVar3);
      incSourceBufferOffset(this);
    }
    iVar5 = getSourceBufferRemain(this);
    if (0 < iVar5) {
      incSourceBufferOffset(this);
    }
  }
  if (wordBuffer->_M_string_length < 0x100) {
    if ((this->localVariables).
        super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->localVariables).
        super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::__cxx11::string::string((string *)&localName,wordBuffer);
      for (sVar9 = 0; localName._M_string_length != sVar9; sVar9 = sVar9 + 1) {
        cVar1 = localName._M_dataplus._M_p[sVar9];
        cVar10 = cVar1 + -0x20;
        if (0x19 < (byte)(cVar1 + 0x9fU)) {
          cVar10 = cVar1;
        }
        localName._M_dataplus._M_p[sVar9] = cVar10;
      }
      __lhs = (this->localVariables).
              super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
              ._M_impl.super__Vector_impl_data._M_start;
      plVar2 = (this->localVariables).
               super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar11 = -(long)__lhs;
      for (; __lhs != plVar2; __lhs = __lhs + 1) {
        _Var4 = std::operator==(&__lhs->localName,&localName);
        if (_Var4) {
          data(this,1);
          data(this,(Cell)(-((long)&(((this->localVariables).
                                      super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->localName).
                                    _M_dataplus._M_p + lVar11) / 0x28));
          std::__cxx11::string::~string((string *)&localName);
          return 0x1a;
        }
        lVar11 = lVar11 + -0x28;
      }
      std::__cxx11::string::~string((string *)&localName);
    }
    XVar8 = findDefinition(this,wordBuffer);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&localName,"WORD: very long word ",&local_51);
    throwMessage(this,&localName,errorParsedStringOverflow);
    std::__cxx11::string::~string((string *)&localName);
    XVar8 = 0;
  }
  return XVar8;
}

Assistant:

Xt blWordFind(std::string &wordBuffer) {

			auto delim = ' ';
			/****

			I need a buffer to store the result of the Forth `WORD` word.  As with the
			input buffer, I use a `std::string` so I don't need to worry about memory
			management.

			Note that while this is a `std::string`, its format is not a typical strings.
			The buffer returned by `WORD` has the word length as its first character.
			That is, it is a Forth _counted string_.

			****/
			wordBuffer.resize(0);  // First char of buffer is length.
			
			// Skip leading delimiters
			if (getSourceBufferRemain() > 0) {
				auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
				while (getSourceBufferRemain() > 0 && ((currentChar == delim)
					|| (delim == ' ' && isspace(static_cast<unsigned char>(currentChar)))
					)) {
					incSourceBufferOffset();
					currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
				}
			}
			if (getSourceBufferRemain() > 0) {
				// Copy characters until we see the delimiter again.
				while (getSourceBufferRemain() >0 ) {
					auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());	
					if( currentChar != delim
					&& !(delim == ' ' && (isspace(static_cast<unsigned char>(currentChar))))
					) {
					wordBuffer.push_back(static_cast<unsigned char>(currentChar));
					incSourceBufferOffset();
					} else {
						break;
					}
				}
				// source point to the delimiter char, skip it.
				if (getSourceBufferRemain() >0 ) {
					incSourceBufferOffset(); 
				}
			}
			if (wordBuffer.size() > 255){
				// @bug it is catched below
				throwMessage(std::string("WORD: very long word "), errorParsedStringOverflow);
				return 0;
			}
			if(localVariables.size()>0){
				std::string localName{wordBuffer};
				for(auto &c: localName) c=toupper_ascii(c);
				for(auto it=localVariables.begin(),itEnd=localVariables.end();it!=itEnd;++it){
					if((*it).localName==localName){
						// compale address of local variable
						// and retrun XT of FETCH @
						data(doLiteralXt);
						data(std::distance(localVariables.begin(),it));
						return pickReturnStackXt ;
					}
				}		
			}
			auto word = findDefinition(wordBuffer);
			return word;
			
		}